

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O3

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  PointerType pSVar4;
  PointerType pcVar5;
  size_t sVar6;
  char *pcVar7;
  PointerType pBVar8;
  PositionType *this_00;
  utsname uts_name;
  char temp [1024];
  string local_5f8;
  long *local_5d8 [2];
  long local_5c8 [2];
  allocator local_5b1;
  utsname local_5b0;
  string local_428 [32];
  
  paVar1 = &local_428[0].field_2;
  local_428[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"UNIX","");
  pcVar7 = local_5b0.sysname + 0x10;
  local_5b0.sysname._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"1","");
  this_00 = &this->Position;
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,local_428,(char *)local_5b0.sysname._0_8_);
  if ((char *)local_5b0.sysname._0_8_ != pcVar7) {
    operator_delete((void *)local_5b0.sysname._0_8_,local_5b0.sysname._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
  }
  local_428[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"CMAKE_HOST_UNIX","");
  local_5b0.sysname._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"1","");
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,local_428,(char *)local_5b0.sysname._0_8_);
  if ((char *)local_5b0.sysname._0_8_ != pcVar7) {
    operator_delete((void *)local_5b0.sysname._0_8_,local_5b0.sysname._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
  }
  iVar2 = uname(&local_5b0);
  if (-1 < iVar2) {
    local_428[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"CMAKE_HOST_SYSTEM_NAME","")
    ;
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    sVar6 = strlen(local_5b0.sysname);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5f8,&local_5b0,local_5b0.sysname + sVar6);
    pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
    cmDefinitions::Set(pcVar5,local_428,local_5f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
      operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_428[0]._M_dataplus._M_p,local_428[0].field_2._M_allocated_capacity + 1);
    }
  }
  uVar3 = cmVersion::GetMinorVersion();
  sprintf((char *)local_428,"%d",(ulong)uVar3);
  paVar1 = &local_5f8.field_2;
  local_5f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"CMAKE_MINOR_VERSION","");
  local_5d8[0] = local_5c8;
  sVar6 = strlen((char *)local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,local_428,(long)&local_428[0]._M_dataplus._M_p + sVar6);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_5f8,(char *)local_5d8[0]);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  uVar3 = cmVersion::GetMajorVersion();
  sprintf((char *)local_428,"%d",(ulong)uVar3);
  local_5f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"CMAKE_MAJOR_VERSION","");
  local_5d8[0] = local_5c8;
  sVar6 = strlen((char *)local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,local_428,(long)&local_428[0]._M_dataplus._M_p + sVar6);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_5f8,(char *)local_5d8[0]);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  uVar3 = cmVersion::GetPatchVersion();
  sprintf((char *)local_428,"%d",(ulong)uVar3);
  local_5f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"CMAKE_PATCH_VERSION","");
  local_5d8[0] = local_5c8;
  sVar6 = strlen((char *)local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,local_428,(long)&local_428[0]._M_dataplus._M_p + sVar6);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_5f8,(char *)local_5d8[0]);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  uVar3 = cmVersion::GetTweakVersion();
  sprintf((char *)local_428,"%d",(ulong)uVar3);
  local_5f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"CMAKE_TWEAK_VERSION","");
  local_5d8[0] = local_5c8;
  sVar6 = strlen((char *)local_428);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,local_428,(long)&local_428[0]._M_dataplus._M_p + sVar6);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_5f8,(char *)local_5d8[0]);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  local_5f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"CMAKE_VERSION","");
  pcVar7 = cmVersion::GetCMakeVersion();
  std::__cxx11::string::string((string *)local_5d8,pcVar7,&local_5b1);
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_5f8,(char *)local_5d8[0]);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  local_5f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f8,"CMAKE_FILES_DIRECTORY","");
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"/CMakeFiles","");
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar5 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar4->Vars);
  cmDefinitions::Set(pcVar5,&local_5f8,(char *)local_5d8[0]);
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  pSVar4 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pBVar8 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar4->BuildSystemDirectory);
  local_5f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f8,"INCLUDE_REGULAR_EXPRESSION","");
  cmPropertyMap::SetProperty(&pBVar8->Properties,&local_5f8,"^.*$");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_5f8._M_dataplus._M_p,local_5f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
/* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
  With CMake must separate between target and host platform. In most cases
  the tests for WIN32, UNIX and APPLE will be for the target system, so an
  additional set of variables for the host system is required ->
  CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
  WIN32, UNIX and APPLE are now set in the platform files in
  Modules/Platforms/.
  To keep cmake scripts (-P) and custom language and compiler modules
  working, these variables are still also set here in this place, but they
  will be reset in CMakeSystemSpecificInformation.cmake before the platform
  files are executed. */
#if defined(_WIN32)
  this->SetDefinition("WIN32", "1");
  this->SetDefinition("CMAKE_HOST_WIN32", "1");
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", "Windows");
#else
  this->SetDefinition("UNIX", "1");
  this->SetDefinition("CMAKE_HOST_UNIX", "1");

  struct utsname uts_name;
  if (uname(&uts_name) >= 0) {
    this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", uts_name.sysname);
  }
#endif
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmSystemTools::IsOn(legacy.c_str())) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

  char temp[1024];
  sprintf(temp, "%d", cmVersion::GetMinorVersion());
  this->SetDefinition("CMAKE_MINOR_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetMajorVersion());
  this->SetDefinition("CMAKE_MAJOR_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetPatchVersion());
  this->SetDefinition("CMAKE_PATCH_VERSION", temp);
  sprintf(temp, "%d", cmVersion::GetTweakVersion());
  this->SetDefinition("CMAKE_TWEAK_VERSION", temp);
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY",
                      cmake::GetCMakeFilesDirectory());

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}